

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::
int_writer<char,_fmt::v6::basic_format_specs<char>_>::on_bin
          (int_writer<char,_fmt::v6::basic_format_specs<char>_> *this)

{
  char cVar1;
  format_specs *pfVar2;
  int num_digits;
  uint uVar3;
  uint uVar4;
  bin_writer<1> bVar5;
  bin_writer<1> f;
  string_view prefix;
  
  pfVar2 = this->specs;
  if ((char)pfVar2->field_0x9 < '\0') {
    uVar3 = this->prefix_size;
    this->prefix_size = uVar3 + 1;
    this->prefix[uVar3] = '0';
    cVar1 = pfVar2->type;
    uVar3 = this->prefix_size;
    this->prefix_size = uVar3 + 1;
    this->prefix[uVar3] = cVar1;
  }
  uVar3 = this->abs_value;
  bVar5.num_digits = 0;
  bVar5.abs_value = uVar3;
  num_digits = 0;
  f = bVar5;
  do {
    f = (bin_writer<1>)((long)f + 0x100000000);
    num_digits = num_digits + 1;
    uVar3 = uVar3 >> 1;
    uVar4 = bVar5.abs_value;
    bVar5.num_digits = 0;
    bVar5.abs_value = uVar3;
  } while (1 < uVar4);
  prefix.data_ = this->prefix;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v6::buffer_range<char>>::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<char,fmt::v6::basic_format_specs<char>>::bin_writer<1>>
            ((basic_writer<fmt::v6::buffer_range<char>> *)this->writer,num_digits,prefix,*pfVar2,f);
  return;
}

Assistant:

void on_bin() {
      if (specs.alt) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = static_cast<char>(specs.type);
      }
      int num_digits = count_digits<1>(abs_value);
      writer.write_int(num_digits, get_prefix(), specs,
                       bin_writer<1>{abs_value, num_digits});
    }